

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

int SSL_write(SSL *ssl,void *buf,int num)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int line;
  bool needs_handshake;
  size_t bytes_written;
  
  bssl::ssl_reset_error_state((SSL *)ssl);
  if (ssl->msg_callback == (_func_3150 *)0x0) {
    lVar1._0_4_ = ssl->rwstate;
    lVar1._4_4_ = ssl->in_handshake;
    if (lVar1 != 0) {
      bytes_written = 0;
      needs_handshake = false;
      do {
        bVar2 = bssl::ssl_can_write((SSL *)ssl);
        if (!bVar2) {
          iVar3 = SSL_do_handshake(ssl);
          if (iVar3 < 0) {
            return iVar3;
          }
          if (iVar3 == 0) {
            iVar3 = 0xd7;
            line = 0x3c6;
            goto LAB_00150ed9;
          }
        }
        if (num < 0) {
          iVar3 = 0x6f;
          line = 0x3cc;
          goto LAB_00150ed9;
        }
        iVar3 = (**(code **)(*(long *)ssl + 0x48))(ssl,&needs_handshake,&bytes_written,buf,num);
        if (needs_handshake == false) {
          if (iVar3 < 1) {
            return iVar3;
          }
          return (int)bytes_written;
        }
      } while( true );
    }
    iVar3 = 0xe2;
    line = 0x3b7;
  }
  else {
    iVar3 = 0x42;
    line = 0x3b2;
  }
LAB_00150ed9:
  ERR_put_error(0x10,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,line);
  return -1;
}

Assistant:

int SSL_write(SSL *ssl, const void *buf, int num) {
  ssl_reset_error_state(ssl);

  if (SSL_is_quic(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return -1;
  }

  if (ssl->do_handshake == NULL) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNINITIALIZED);
    return -1;
  }

  int ret = 0;
  size_t bytes_written = 0;
  bool needs_handshake = false;
  do {
    // If necessary, complete the handshake implicitly.
    if (!ssl_can_write(ssl)) {
      ret = SSL_do_handshake(ssl);
      if (ret < 0) {
        return ret;
      }
      if (ret == 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_SSL_HANDSHAKE_FAILURE);
        return -1;
      }
    }

    if (num < 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_LENGTH);
      return -1;
    }
    ret = ssl->method->write_app_data(
        ssl, &needs_handshake, &bytes_written,
        Span(static_cast<const uint8_t *>(buf), static_cast<size_t>(num)));
  } while (needs_handshake);
  return ret <= 0 ? ret : static_cast<int>(bytes_written);
}